

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

int __thiscall
NNTreeImpl::binarySearch
          (NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *items,int num_items,
          bool return_prev_if_not_found,offset_in_NNTreeImpl_to_subr compare)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  long *plVar4;
  code *in_stack_00000008;
  long in_stack_00000010;
  code *local_98;
  int local_5c;
  int status;
  bool found_leq;
  int iStack_50;
  bool found;
  int found_idx;
  int idx;
  int checks;
  int step;
  int max_idx;
  offset_in_NNTreeImpl_to_subr compare_local;
  bool return_prev_if_not_found_local;
  int num_items_local;
  QPDFObjectHandle *items_local;
  QPDFObjectHandle *key_local;
  NNTreeImpl *this_local;
  
  for (checks = 1; checks < num_items; checks = checks << 1) {
  }
  iStack_50 = checks / 2;
  found_idx = checks;
  status = -1;
  bVar2 = false;
  bVar3 = false;
  idx = iStack_50;
  while (!bVar2 && 0 < found_idx) {
    if (iStack_50 < num_items) {
      plVar4 = (long *)((long)&this->details + in_stack_00000010);
      if (((ulong)in_stack_00000008 & 1) == 0) {
        local_98 = in_stack_00000008;
      }
      else {
        local_98 = *(code **)(in_stack_00000008 + *plVar4 + -1);
      }
      local_5c = (*local_98)(plVar4,key,items,iStack_50);
      if (-1 < local_5c) {
        bVar3 = true;
        status = iStack_50;
      }
    }
    else {
      local_5c = -1;
    }
    if (local_5c == 0) {
      bVar2 = true;
    }
    else {
      found_idx = found_idx >> 1;
      if (0 < found_idx) {
        idx = idx >> 1;
        if (idx == 0) {
          idx = 1;
        }
        iVar1 = idx;
        if (local_5c < 0) {
          iVar1 = -idx;
        }
        iStack_50 = iStack_50 + iVar1;
      }
    }
  }
  if ((bVar2) || ((bVar3 && (return_prev_if_not_found)))) {
    this_local._4_4_ = status;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int
NNTreeImpl::binarySearch(
    QPDFObjectHandle key,
    QPDFObjectHandle items,
    int num_items,
    bool return_prev_if_not_found,
    int (NNTreeImpl::*compare)(QPDFObjectHandle& key, QPDFObjectHandle& arr, int item))
{
    int max_idx = 1;
    while (max_idx < num_items) {
        max_idx <<= 1;
    }

    int step = max_idx / 2;
    int checks = max_idx;
    int idx = step;
    int found_idx = -1;
    bool found = false;
    bool found_leq = false;
    int status = 0;

    while ((!found) && (checks > 0)) {
        if (idx < num_items) {
            status = (this->*compare)(key, items, idx);
            if (status >= 0) {
                found_leq = true;
                found_idx = idx;
            }
        } else {
            // consider item to be below anything after the top
            status = -1;
        }

        if (status == 0) {
            found = true;
        } else {
            checks >>= 1;
            if (checks > 0) {
                step >>= 1;
                if (step == 0) {
                    step = 1;
                }

                if (status < 0) {
                    idx -= step;
                } else {
                    idx += step;
                }
            }
        }
    }

    if (found || (found_leq && return_prev_if_not_found)) {
        return found_idx;
    } else {
        return -1;
    }
}